

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall
Catch::CompactReporter::assertionEnded(CompactReporter *this,AssertionStats *_assertionStats)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  OfType OVar2;
  char cVar3;
  int iVar4;
  ostream *poVar5;
  undefined8 *puVar6;
  char *pcVar7;
  Code colour;
  undefined8 uVar8;
  _Alloc_hider _Var9;
  Colour colourGuard;
  AssertionPrinter printer;
  size_type __dnew;
  string local_a8;
  undefined1 local_81;
  AssertionPrinter local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  undefined8 local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  iVar4 = (*(((this->super_StreamingReporterBase<Catch::CompactReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[5])();
  local_80.printInfoMessages = true;
  if (((char)iVar4 == '\0') &&
     (((OVar2 = (_assertionStats->assertionResult).m_resultData.resultType,
       (OVar2 & FailureBit) == Ok ||
       (((_assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) != 0)) &&
      (local_80.printInfoMessages = false, OVar2 != Warning)))) {
    return false;
  }
  local_80.result = &_assertionStats->assertionResult;
  local_80.stream = (this->super_StreamingReporterBase<Catch::CompactReporter>).stream;
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (&local_80.messages,&_assertionStats->infoMessages);
  local_80.itMessage._M_current =
       (_assertionStats->infoMessages).
       super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_81 = 0;
  Colour::use(FileName);
  poVar5 = local_80.stream;
  local_a8._M_dataplus._M_p = ((local_80.result)->m_info).lineInfo.file;
  local_a8._M_string_length = ((local_80.result)->m_info).lineInfo.line;
  operator<<(local_80.stream,(SourceLineInfo *)&local_a8);
  local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)CONCAT71(local_48._1_7_,0x3a);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_48,1);
  Colour::use(None);
  local_80.itMessage._M_current =
       local_80.messages.super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  OVar2 = ((local_80.result)->m_resultData).resultType;
  if (ExpressionFailed < OVar2) {
    if (OVar2 < ThrewException) {
      if (OVar2 == ExplicitFailure) {
        paVar1 = &local_a8.field_2;
        local_a8._M_string_length = 6;
        local_a8.field_2._M_allocated_capacity._0_7_ = 0x64656c696166;
        local_a8._M_dataplus._M_p = (pointer)paVar1;
        anon_unknown_1::AssertionPrinter::printResultType(&local_80,BrightRed,&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        local_a8.field_2._M_allocated_capacity = 0x746963696c707865;
        local_a8._M_string_length = 10;
        local_a8.field_2._8_3_ = 0x796c;
        local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)CONCAT71(local_48._1_7_,0x20);
        local_a8._M_dataplus._M_p = (pointer)paVar1;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_80.stream,(char *)&local_48,1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,local_a8._M_dataplus._M_p,local_a8._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_a8._M_dataplus._M_p,
                          (ulong)(local_a8.field_2._M_allocated_capacity + 1));
        }
        colour = None;
        goto LAB_0012b676;
      }
      if (OVar2 != Exception) goto LAB_0012b682;
      goto switchD_0012b021_caseD_ffffffff;
    }
    if (OVar2 == ThrewException) {
      paVar1 = &local_a8.field_2;
      local_a8._M_string_length = 6;
      local_a8.field_2._M_allocated_capacity._0_7_ = 0x64656c696166;
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      anon_unknown_1::AssertionPrinter::printResultType(&local_80,BrightRed,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x22;
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      local_a8._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)&local_48);
      local_a8.field_2._M_allocated_capacity = (size_type)local_48;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0x10) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0x11) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0x12) = 'o';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0x13) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0x14) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0x15) = 'w';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0x16) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0x17) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0x18) = 'h';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0x19) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0x1a) = 'm';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0x1b) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0x1c) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0x1d) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0x1e) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0x1f) = 'g';
      *(undefined8 *)local_a8._M_dataplus._M_p = 0x7463657078656e75;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 8) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 9) = 'd';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 10) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0xb) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0xc) = 'x';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0xd) = 'c';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0xe) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0xf) = 'p';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0x20) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0x21) = ':';
      local_a8._M_string_length = (size_type)local_48;
      local_a8._M_dataplus._M_p[(long)local_48] = '\0';
      local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)CONCAT71(local_48._1_7_,0x20);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_80.stream,(char *)&local_48,1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,local_a8._M_dataplus._M_p,local_a8._M_string_length);
LAB_0012b4cc:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,
                        (ulong)(local_a8.field_2._M_allocated_capacity + 1));
      }
      anon_unknown_1::AssertionPrinter::printMessage(&local_80);
    }
    else {
      if (OVar2 != DidntThrowException) {
        if (OVar2 != FatalErrorCondition) goto LAB_0012b682;
        paVar1 = &local_a8.field_2;
        local_a8._M_string_length = 6;
        local_a8.field_2._M_allocated_capacity._0_7_ = 0x64656c696166;
        local_a8._M_dataplus._M_p = (pointer)paVar1;
        anon_unknown_1::AssertionPrinter::printResultType(&local_80,BrightRed,&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x23;
        local_a8._M_dataplus._M_p = (pointer)paVar1;
        local_a8._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)&local_48);
        local_a8.field_2._M_allocated_capacity = (size_type)local_48;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p + 0x10) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p + 0x11) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p + 0x12) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p + 0x13) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p + 0x14) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p + 0x15) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p + 0x16) = 'w';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p + 0x17) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p + 0x18) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p + 0x19) = 'h';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p + 0x1a) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p + 0x1b) = 'm';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p + 0x1c) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p + 0x1d) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p + 0x1e) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p + 0x1f) = 'a';
        *(undefined8 *)local_a8._M_dataplus._M_p = 0x7265206c61746166;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p + 8) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p + 9) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p + 10) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p + 0xb) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p + 0xc) = 'c';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p + 0xd) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p + 0xe) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p + 0xf) = 'd';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p + 0x1f) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p + 0x20) = 'g';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p + 0x21) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p + 0x22) = ':';
        local_a8._M_string_length = (size_type)local_48;
        local_a8._M_dataplus._M_p[(long)local_48] = '\0';
        local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)CONCAT71(local_48._1_7_,0x20);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_80.stream,(char *)&local_48,1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,local_a8._M_dataplus._M_p,local_a8._M_string_length);
        goto LAB_0012b4cc;
      }
      paVar1 = &local_a8.field_2;
      local_a8._M_string_length = 6;
      local_a8.field_2._M_allocated_capacity._0_7_ = 0x64656c696166;
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      anon_unknown_1::AssertionPrinter::printResultType(&local_80,BrightRed,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x1c;
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      local_a8._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)&local_48);
      local_a8.field_2._M_allocated_capacity = (size_type)local_48;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0xc) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0xd) = 'p';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0xe) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0xf) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0x10) = 'o';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0x11) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0x12) = ',';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0x13) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0x14) = 'g';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0x15) = 'o';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0x16) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0x17) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0x18) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0x19) = 'o';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0x1a) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0x1b) = 'e';
      *(undefined8 *)local_a8._M_dataplus._M_p = 0x6465746365707865;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 8) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 9) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 10) = 'x';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0xb) = 'c';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0xc) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0xd) = 'p';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0xe) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0xf) = 'i';
      local_a8._M_string_length = (size_type)local_48;
      local_a8._M_dataplus._M_p[(long)local_48] = '\0';
      local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)CONCAT71(local_48._1_7_,0x20);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_80.stream,(char *)&local_48,1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,local_a8._M_dataplus._M_p,local_a8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_a8._M_dataplus._M_p,
                        (ulong)(local_a8.field_2._M_allocated_capacity + 1));
      }
    }
    colour = FileName;
    anon_unknown_1::AssertionPrinter::printExpressionWas(&local_80);
    goto LAB_0012b676;
  }
  switch(OVar2) {
  case Ok:
    local_a8._M_string_length = 6;
    local_a8.field_2._M_allocated_capacity._0_7_ = 0x646573736170;
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    anon_unknown_1::AssertionPrinter::printResultType(&local_80,BrightGreen,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,(ulong)(local_a8.field_2._M_allocated_capacity + 1))
      ;
    }
    anon_unknown_1::AssertionPrinter::printOriginalExpression(&local_80);
    anon_unknown_1::AssertionPrinter::printReconstructedExpression(&local_80);
    colour = FileName;
    if (((local_80.result)->m_info).capturedExpression.m_size == 0) {
      colour = None;
    }
    goto LAB_0012b676;
  case Info:
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    local_a8._M_string_length = 4;
    local_a8.field_2._M_allocated_capacity._0_5_ = 0x6f666e69;
    anon_unknown_1::AssertionPrinter::printResultType(&local_80,None,&local_a8);
    goto LAB_0012b562;
  case Warning:
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    local_a8._M_string_length = 7;
    local_a8.field_2._M_allocated_capacity = 0x676e696e726177;
    anon_unknown_1::AssertionPrinter::printResultType(&local_80,None,&local_a8);
LAB_0012b562:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,(ulong)(local_a8.field_2._M_allocated_capacity + 1))
      ;
    }
    colour = FileName;
    anon_unknown_1::AssertionPrinter::printMessage(&local_80);
LAB_0012b676:
    anon_unknown_1::AssertionPrinter::printRemainingMessages(&local_80,colour);
    break;
  default:
    if (OVar2 != FailureBit) {
      if (OVar2 != ExpressionFailed) break;
      if ((((local_80.result)->m_info).resultDisposition & SuppressFail) == 0) {
        local_a8._M_string_length = 6;
        local_a8.field_2._M_allocated_capacity._0_7_ = 0x64656c696166;
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        anon_unknown_1::AssertionPrinter::printResultType(&local_80,BrightRed,&local_a8);
        uVar8 = local_a8.field_2._M_allocated_capacity;
        _Var9._M_p = local_a8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
LAB_0012b655:
          operator_delete(_Var9._M_p,(ulong)(uVar8 + 1));
        }
      }
      else {
        local_38._M_allocated_capacity._0_5_ = 0x7562202d20;
        local_38._M_allocated_capacity._5_3_ = 0x772074;
        local_38._8_5_ = 0x6b6f207361;
        local_40 = 0xd;
        local_38._M_local_buf[0xd] = '\0';
        local_48 = &local_38;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x16fc39);
        pcVar7 = (char *)(puVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar7) {
          local_a8.field_2._M_allocated_capacity = *(undefined8 *)pcVar7;
          local_a8.field_2._8_8_ = puVar6[3];
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        }
        else {
          local_a8.field_2._M_allocated_capacity = *(undefined8 *)pcVar7;
          local_a8._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_a8._M_string_length = puVar6[1];
        *puVar6 = pcVar7;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        anon_unknown_1::AssertionPrinter::printResultType(&local_80,BrightGreen,&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,
                          (ulong)(local_a8.field_2._M_allocated_capacity + 1));
        }
        if (local_48 != &local_38) {
          uVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT35(local_38._M_allocated_capacity._5_3_,
                              local_38._M_allocated_capacity._0_5_);
          _Var9._M_p = (pointer)local_48;
          goto LAB_0012b655;
        }
      }
      anon_unknown_1::AssertionPrinter::printOriginalExpression(&local_80);
      colour = FileName;
      anon_unknown_1::AssertionPrinter::printReconstructedExpression(&local_80);
      goto LAB_0012b676;
    }
  case Unknown:
switchD_0012b021_caseD_ffffffff:
    local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x14;
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    local_a8._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)&local_48);
    local_a8.field_2._M_allocated_capacity = (size_type)local_48;
    *(undefined8 *)local_a8._M_dataplus._M_p = 0x7265746e69202a2a;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 8) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 9) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 10) = 'l';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0xb) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0xc) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0xd) = 'r';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0xe) = 'r';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0xf) = 'o';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0x10) = 'r';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0x11) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0x12) = '*';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0x13) = '*';
    local_a8._M_string_length = (size_type)local_48;
    local_a8._M_dataplus._M_p[(long)local_48] = '\0';
    anon_unknown_1::AssertionPrinter::printResultType(&local_80,BrightRed,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,(ulong)(local_a8.field_2._M_allocated_capacity + 1))
      ;
    }
  }
LAB_0012b682:
  poVar5 = (this->super_StreamingReporterBase<Catch::CompactReporter>).stream;
  cVar3 = (char)poVar5;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector
            (&local_80.messages);
  return true;
}

Assistant:

bool CompactReporter::assertionEnded( AssertionStats const& _assertionStats ) {
            AssertionResult const& result = _assertionStats.assertionResult;

            bool printInfoMessages = true;

            // Drop out if result was successful and we're not printing those
            if( !m_config->includeSuccessfulResults() && result.isOk() ) {
                if( result.getResultType() != ResultWas::Warning )
                    return false;
                printInfoMessages = false;
            }

            AssertionPrinter printer( stream, _assertionStats, printInfoMessages );
            printer.print();

            stream << std::endl;
            return true;
        }